

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cc
# Opt level: O2

void __thiscall Buffer::Buffer(Buffer *this,size_t size)

{
  _Head_base<0UL,_Buffer::Members_*,_false> this_00;
  
  this_00._M_head_impl = (Members *)operator_new(0x38);
  Members::Members(this_00._M_head_impl,size,(uchar *)0x0,true);
  (this->m)._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
  super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
  super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl = this_00._M_head_impl;
  return;
}

Assistant:

Buffer::Buffer(size_t size) :
    m(new Members(size, nullptr, true))
{
}